

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_hkdf_expand_label
              (ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
              char *label,ptls_iovec_t hash_value,char *base_label)

{
  ptls_iovec_t info;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *__s;
  uint8_t *puVar6;
  ptls_iovec_t prk;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_298;
  uint8_t *local_270;
  size_t local_268;
  ptls_hash_algorithm_t *local_260;
  void *local_258;
  uint8_t *local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_250 = secret.base;
  local_298.base = local_238;
  local_298.off = 0;
  local_298.capacity = 0x200;
  local_298._24_8_ = local_298._24_8_ & 0xffffffff00000000;
  local_260 = algo;
  local_258 = output;
  iVar3 = ptls_buffer_reserve(&local_298,2);
  if (iVar3 == 0) {
    *(ushort *)(local_298.base + local_298.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_298.off = local_298.off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    iVar3 = ptls_buffer_reserve(&local_298,1);
    if (iVar3 == 0) {
      local_298.base[local_298.off] = '\0';
      local_298.off = local_298.off + 1;
      iVar3 = 0;
    }
    iVar5 = 6;
    puVar6 = (uint8_t *)secret.len;
    if (iVar3 == 0) {
      local_268 = local_298.off;
      __s = "tls13 ";
      if (base_label != (char *)0x0) {
        __s = base_label;
      }
      local_270 = (uint8_t *)secret.len;
      sVar4 = strlen(__s);
      iVar3 = 0;
      if ((sVar4 != 0) &&
         (iVar3 = ptls_buffer_reserve(&local_298,sVar4), sVar1 = local_298.off, iVar3 == 0)) {
        memcpy(local_298.base + local_298.off,__s,sVar4);
        local_298.off = sVar4 + sVar1;
        iVar3 = 0;
      }
      puVar6 = local_270;
      if (iVar3 == 0) {
        sVar4 = strlen(label);
        iVar3 = 0;
        if ((sVar4 != 0) &&
           (iVar3 = ptls_buffer_reserve(&local_298,sVar4), sVar1 = local_298.off, iVar3 == 0)) {
          memcpy(local_298.base + local_298.off,label,sVar4);
          local_298.off = sVar4 + sVar1;
          iVar3 = 0;
        }
        puVar6 = local_270;
        if (iVar3 == 0) {
          local_298.base[local_268 - 1] = (char)local_298.off - (char)local_268;
          iVar5 = 0;
          iVar3 = 0;
        }
      }
    }
    if (iVar5 != 6) {
      if (iVar5 != 0) {
        return iVar3;
      }
      iVar3 = ptls_buffer_reserve(&local_298,1);
      if (iVar3 == 0) {
        local_298.base[local_298.off] = '\0';
        local_298.off = local_298.off + 1;
        iVar3 = 0;
      }
      sVar1 = local_298.off;
      iVar5 = 6;
      if (iVar3 == 0) {
        iVar3 = 0;
        if (hash_value.len != 0) {
          local_270 = hash_value.base;
          iVar3 = ptls_buffer_reserve(&local_298,hash_value.len);
          sVar2 = local_298.off;
          if (iVar3 == 0) {
            memcpy(local_298.base + local_298.off,local_270,hash_value.len);
            local_298.off = sVar2 + hash_value.len;
            iVar3 = 0;
          }
        }
        if (iVar3 == 0) {
          local_298.base[sVar1 - 1] = (char)local_298.off - (char)sVar1;
          iVar5 = 0;
        }
      }
      if (iVar5 != 6) {
        if (iVar5 != 0) {
          return iVar3;
        }
        local_248 = local_298.base;
        sStack_240 = local_298.off;
        info.len = local_298.off;
        info.base = local_298.base;
        prk.len = (size_t)puVar6;
        prk.base = local_250;
        iVar3 = ptls_hkdf_expand(local_260,local_258,outlen,prk,info);
      }
    }
  }
  puVar6 = local_298.base;
  (*ptls_clear_memory)(local_298.base,local_298.off);
  if (local_298.is_allocated != 0) {
    free(puVar6);
  }
  return iVar3;
}

Assistant:

int ptls_hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                           ptls_iovec_t hash_value, const char *base_label)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        if (base_label == NULL)
            base_label = "tls13 ";
        ptls_buffer_pushv(&hkdf_label, base_label, strlen(base_label));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}